

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialer.c
# Opt level: O0

int nni_dialer_setopt(nni_dialer *d,char *name,void *val,size_t sz,nni_type t)

{
  int iVar1;
  bool bVar2;
  int rv_2;
  int rv_1;
  int rv;
  nni_option *o;
  nni_type t_local;
  size_t sz_local;
  void *val_local;
  char *name_local;
  nni_dialer *d_local;
  
  iVar1 = strcmp(name,"reconnect-time-max");
  if (iVar1 == 0) {
    nni_mtx_lock(&d->d_mtx);
    d_local._4_4_ = nni_copyin_ms(&d->d_maxrtime,val,sz,t);
    nni_mtx_unlock(&d->d_mtx);
  }
  else {
    iVar1 = strcmp(name,"reconnect-time-min");
    if (iVar1 == 0) {
      nni_mtx_lock(&d->d_mtx);
      d_local._4_4_ = nni_copyin_ms(&d->d_inirtime,val,sz,t);
      if (d_local._4_4_ == 0) {
        d->d_currtime = d->d_inirtime;
      }
      nni_mtx_unlock(&d->d_mtx);
    }
    else if (((d->d_ops).d_setopt == (_func_int_void_ptr_char_ptr_void_ptr_size_t_nni_type *)0x0) ||
            (d_local._4_4_ = (*(d->d_ops).d_setopt)(d->d_data,name,val,sz,t), d_local._4_4_ == 9)) {
      _rv_1 = (d->d_ops).d_options;
      while( true ) {
        bVar2 = false;
        if (_rv_1 != (nni_option *)0x0) {
          bVar2 = _rv_1->o_name != (char *)0x0;
        }
        if (!bVar2) {
          return 9;
        }
        iVar1 = strcmp(_rv_1->o_name,name);
        if (iVar1 == 0) break;
        _rv_1 = _rv_1 + 1;
      }
      if (_rv_1->o_set == (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
        d_local._4_4_ = 0x18;
      }
      else {
        d_local._4_4_ = (*_rv_1->o_set)(d->d_data,val,sz,t);
      }
    }
  }
  return d_local._4_4_;
}

Assistant:

int
nni_dialer_setopt(
    nni_dialer *d, const char *name, const void *val, size_t sz, nni_type t)
{
	nni_option *o;

	if (strcmp(name, NNG_OPT_RECONNMAXT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyin_ms(&d->d_maxrtime, val, sz, t);
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}
	if (strcmp(name, NNG_OPT_RECONNMINT) == 0) {
		int rv;
		nni_mtx_lock(&d->d_mtx);
		rv = nni_copyin_ms(&d->d_inirtime, val, sz, t);
		if (rv == 0) {
			d->d_currtime = d->d_inirtime;
		}
		nni_mtx_unlock(&d->d_mtx);
		return (rv);
	}

	if (d->d_ops.d_setopt != NULL) {
		int rv = d->d_ops.d_setopt(d->d_data, name, val, sz, t);
		if (rv != NNG_ENOTSUP) {
			return (rv);
		}
	}

	for (o = d->d_ops.d_options; o && o->o_name; o++) {
		if (strcmp(o->o_name, name) != 0) {
			continue;
		}
		if (o->o_set == NULL) {
			return (NNG_EREADONLY);
		}

		return (o->o_set(d->d_data, val, sz, t));
	}

	return (NNG_ENOTSUP);
}